

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrtarga.c
# Opt level: O1

void put_demapped_gray(j_decompress_ptr cinfo,djpeg_dest_ptr dinfo,JDIMENSION rows_supplied)

{
  JDIMENSION JVar1;
  JSAMPROW pJVar2;
  _func_void_j_decompress_ptr_djpeg_dest_ptr *p_Var3;
  JSAMPROW pJVar4;
  tga_dest_ptr dest;
  long lVar5;
  
  JVar1 = cinfo->output_width;
  if (JVar1 != 0) {
    pJVar2 = *cinfo->colormap;
    p_Var3 = dinfo[1].start_output;
    pJVar4 = *dinfo->buffer;
    lVar5 = 0;
    do {
      p_Var3[lVar5] = (_func_void_j_decompress_ptr_djpeg_dest_ptr)pJVar2[pJVar4[lVar5]];
      lVar5 = lVar5 + 1;
    } while (JVar1 != (JDIMENSION)lVar5);
  }
  fwrite(dinfo[1].start_output,1,(ulong)*(uint *)&dinfo[1].put_pixel_rows,(FILE *)dinfo->output_file
        );
  return;
}

Assistant:

METHODDEF(void)
put_demapped_gray(j_decompress_ptr cinfo, djpeg_dest_ptr dinfo,
                  JDIMENSION rows_supplied)
{
  tga_dest_ptr dest = (tga_dest_ptr)dinfo;
  register JSAMPROW inptr;
  register char *outptr;
  register JSAMPROW color_map0 = cinfo->colormap[0];
  register JDIMENSION col;

  inptr = dest->pub.buffer[0];
  outptr = dest->iobuffer;
  for (col = cinfo->output_width; col > 0; col--) {
    *outptr++ = color_map0[*inptr++];
  }
  (void)JFWRITE(dest->pub.output_file, dest->iobuffer, dest->buffer_width);
}